

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ProblemType Clasp::detectProblemType(istream *in)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ProblemType unaff_R14D;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = std::istream::peek();
  bVar7 = uVar2 == 0xffffffff;
  if (!bVar7) {
    uVar6 = 1;
    uVar4 = 1;
    do {
      iVar5 = uVar2 << 0x18;
      if ((iVar5 == 0x20000000) || (iVar5 == 0x9000000)) {
        std::istream::get();
        uVar6 = (ulong)((int)uVar6 + 1);
        iVar3 = 3;
      }
      else {
        cVar1 = (char)uVar2;
        iVar3 = 1;
        if (cVar1 == 'a' || (byte)(cVar1 - 0x30U) < 10) {
          unaff_R14D = Asp;
        }
        else if (cVar1 == '*') {
          unaff_R14D = Pb;
        }
        else if (((uVar2 & 0xff) == 99) || ((uVar2 & 0xff) == 0x70)) {
          unaff_R14D = Sat;
        }
        else {
          if (iVar5 != 0xa000000) {
            Potassco::fail(-2,"ProblemType Clasp::detectProblemType(std::istream &)",0x34,
                           "c == \'\\n\'",
                           "parse error in line %d:%d: \'%c\': unrecognized input format",
                           (ulong)uVar4,uVar6,(ulong)(uint)(iVar5 >> 0x18),0);
          }
          std::istream::get();
          uVar4 = uVar4 + 1;
          iVar3 = 0;
        }
      }
      if ((iVar3 != 3) && (iVar3 != 0)) break;
      uVar2 = std::istream::peek();
      bVar7 = uVar2 == 0xffffffff;
    } while (!bVar7);
  }
  if (bVar7) {
    Potassco::fail(-2,"ProblemType Clasp::detectProblemType(std::istream &)",0x38,"false",
                   "bad input stream",0);
  }
  return unaff_R14D;
}

Assistant:

ProblemType detectProblemType(std::istream& in) {
	for (std::istream::int_type x, line = 1, pos = 1; (x = in.peek()) != std::char_traits<char>::eof();) {
		char c = static_cast<char>(x);
		if (c == ' ' || c == '\t')  { in.get(); ++pos; continue; }
		if (AspParser::accept(c))   { return Problem_t::Asp; }
		if (DimacsReader::accept(c)){ return Problem_t::Sat; }
		if (OpbReader::accept(c))   { return Problem_t::Pb;  }
		POTASSCO_REQUIRE(c == '\n', "parse error in line %d:%d: '%c': unrecognized input format", (int)line,(int)pos, c);
		in.get();
		++line;
	}
	POTASSCO_REQUIRE(false, "bad input stream");
}